

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O0

inst_t * inst_new(opcode_t op,uint32_t p1,uint32_t p2,uint32_t p3,optag_t tag,int64_t n,double d,
                 uint32_t lineno)

{
  inst_t *piVar1;
  inst_t *inst;
  double d_local;
  int64_t n_local;
  optag_t tag_local;
  uint32_t p3_local;
  uint32_t p2_local;
  uint32_t p1_local;
  opcode_t op_local;
  
  piVar1 = (inst_t *)gravity_calloc((gravity_vm *)0x0,1,0x28);
  piVar1->op = op;
  piVar1->tag = tag;
  piVar1->p1 = p1;
  piVar1->p2 = p2;
  piVar1->p3 = p3;
  piVar1->lineno = lineno;
  if (tag == DOUBLE_TAG) {
    (piVar1->field_5).d = d;
  }
  else if (tag == INT_TAG) {
    (piVar1->field_5).n = n;
  }
  if (piVar1 == (inst_t *)0x0) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_ircode.c"
                  ,0x8d,
                  "inst_t *inst_new(opcode_t, uint32_t, uint32_t, uint32_t, optag_t, int64_t, double, uint32_t)"
                 );
  }
  return piVar1;
}

Assistant:

static inst_t *inst_new (opcode_t op, uint32_t p1, uint32_t p2, uint32_t p3, optag_t tag, int64_t n, double d, uint32_t lineno) {

    // debug code
    #if GRAVITY_OPCODE_DEBUG
    if (tag == LABEL_TAG) {
        DEBUG_OPCODE("LABEL %d", p1);
    } else if (tag != PRAGMA_MOVE_OPTIMIZATION){
        const char *op_name = opcode_name(op);

        if (op == LOADI) {
            if (tag == DOUBLE_TAG)
                printf("%s %d %.2f\n", op_name, p1, d);
            else
                printf("%s %d %lld\n", op_name, p1, n);
        } else {
            int nop = opcode_numop(op);
            if (nop == 0) {
                DEBUG_OPCODE("%s", op_name);
            } else if (nop == 1) {
                DEBUG_OPCODE("%s %d", op_name, p1);
            } else if (nop == 2) {
                DEBUG_OPCODE("%s %d %d", op_name, p1, p2);
            } else if (nop == 3) {
                DEBUG_OPCODE("%s %d %d %d", opcode_name(op), p1, p2, p3);
            }
        }
    }
    #endif

    inst_t *inst = (inst_t *)mem_alloc(NULL, sizeof(inst_t));
    inst->op = op;
    inst->tag = tag;
    inst->p1 = p1;
    inst->p2 = p2;
    inst->p3 = p3;
    inst->lineno = lineno;

    if (tag == DOUBLE_TAG) inst->d = d;
    else if (tag == INT_TAG) inst->n = n;

    assert(inst);
    return inst;
}